

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
SetPropertyFromDescriptor<false,Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> *this,
          DynamicObject *instance,PropertyId propertyId,JavascriptString *propertyKey,
          SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  int *piVar1;
  byte bVar2;
  JavascriptLibrary *pJVar3;
  JavascriptString *this_00;
  undefined8 *puVar4;
  code *pcVar5;
  bool bVar6;
  PropertyAttributes PVar7;
  charcount_t cVar8;
  charcount_t cVar9;
  int iVar10;
  BOOL BVar11;
  PropertyId propertyId_00;
  undefined4 *puVar12;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar13;
  JavascriptString **ppJVar14;
  char16 *string1;
  char16 *string2;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *pSVar15;
  UndeclaredBlockVariable *pUVar16;
  unsigned_short uVar17;
  ScriptContext *pSVar18;
  PropertyRecord *local_78;
  PropertyRecord *propertyRecord;
  Var local_68;
  JavascriptString *local_60;
  ScriptContext *local_58;
  ScriptContext *local_50;
  ushort local_42;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSStack_40;
  unsigned_short propertyIndex;
  PropertyOperationFlags local_34;
  
  local_60 = (JavascriptString *)CONCAT44(local_60._4_4_,propertyId);
  local_34 = flags;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    local_50 = (ScriptContext *)instance;
    pSStack_40 = descriptor;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar6) goto LAB_00e1c40f;
    *puVar12 = 0;
    instance = (DynamicObject *)local_50;
    descriptor = pSStack_40;
  }
  bVar2 = descriptor->Attributes;
  if ((bVar2 & 0x10) != 0) {
    pDVar13 = ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>,Js::PropertyRecord_const*>
                        (this,instance);
    piVar1 = (int *)((long)(((((ScriptContext *)instance)->super_ScriptContextBase).
                            javascriptLibrary)->super_JavascriptLibraryBase).globalObject.ptr[0xb].
                           super_RootObjectBase.super_DynamicObject.field_1 + 0x614);
    *piVar1 = *piVar1 + 1;
    iVar10 = (*(pDVar13->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                       (pDVar13,instance,(ulong)local_60 & 0xffffffff,value,(ulong)local_34,info);
    return iVar10;
  }
  pJVar3 = (((ScriptContext *)instance)->super_ScriptContextBase).javascriptLibrary;
  pSVar18 = *(ScriptContext **)
             &(pJVar3->super_JavascriptLibraryBase).globalObject.ptr[0xb].super_RootObjectBase.
              super_DynamicObject.field_1.field_1;
  if ((bVar2 & 8) == 0) {
    if ((local_34 & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (bVar2 & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(local_34,pSVar18);
      if (info == (PropertyValueInfo *)0x0) {
        return 0;
      }
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar15 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                            *)this,instance);
      iVar10 = (*(pSVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x18])
                         (pSVar15,instance,propertyKey,value,(ulong)local_34,info);
      return iVar10;
    }
    local_58 = pSVar18;
    pSStack_40 = descriptor;
    if (*(char *)&(pJVar3->super_JavascriptLibraryBase).arrayConstructor.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&(pJVar3->super_JavascriptLibraryBase).arrayConstructor.ptr + 1) == '\x01'
         )) {
        AssertCount = AssertCount + 1;
        local_50 = (ScriptContext *)instance;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar6) goto LAB_00e1c40f;
        *puVar12 = 0;
        instance = (DynamicObject *)local_50;
      }
      DynamicObject::ChangeType(instance);
    }
    propertyRecord = (PropertyRecord *)info;
    local_68 = value;
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar6 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                ::TryUndeleteProperty
                          ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                            *)this,instance,pSStack_40->propertyIndex,&local_42), bVar6)) {
      ppJVar14 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                              **)(this + 0x18),(uint)local_42);
      this_00 = *ppJVar14;
      cVar8 = JavascriptString::GetLength(this_00);
      local_60 = propertyKey;
      cVar9 = JavascriptString::GetLength(propertyKey);
      if (cVar8 == cVar9) {
        string1 = JavascriptString::GetString(this_00);
        string2 = JavascriptString::GetString(local_60);
        cVar8 = JavascriptString::GetLength(this_00);
        if ((string1 != string2) &&
           (iVar10 = PAL_wmemcmp(string1,string2,(ulong)cVar8), iVar10 != 0)) goto LAB_00e1bf52;
      }
      else {
LAB_00e1bf52:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar6) goto LAB_00e1c40f;
        *puVar12 = 0;
      }
      pSStack_40 = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                                      **)(this + 0x18),(uint)local_42);
      propertyKey = local_60;
    }
    bVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                        *)this,local_58);
    if (bVar6) {
      this[0x29] = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>)
                   ((char)this[0x29] + -1);
    }
    pSStack_40->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    local_78 = (PropertyRecord *)0x0;
    ScriptContext::FindPropertyRecord
              ((ScriptContext *)
               (((((ScriptContext *)instance)->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).globalObject.ptr[0xb].super_RootObjectBase.
               super_DynamicObject.field_1,propertyKey,&local_78);
    info = (PropertyValueInfo *)propertyRecord;
    if (local_78 == (PropertyRecord *)0x0) {
      iVar10 = -1;
    }
    else {
      iVar10 = local_78->pid;
    }
    if (iVar10 != -1) {
      ScriptContext::InvalidateProtoCaches(local_58,iVar10);
    }
    local_60 = (JavascriptString *)CONCAT44(local_60._4_4_,iVar10);
    pSStack_40->Attributes = '\a';
    pSVar18 = local_58;
    descriptor = pSStack_40;
    value = local_68;
  }
  if (descriptor->propertyIndex != 0xffff) {
    pSStack_40 = descriptor;
    if ((((-1 < (char)(undefined1)local_34) && (0x3f < descriptor->Attributes)) &&
        (local_68 = value,
        pUVar16 = (UndeclaredBlockVariable *)
                  DynamicObject::GetSlot(instance,(uint)descriptor->propertyIndex), value = local_68
        , (local_34 >> 8 & 1) == 0)) &&
       ((((pSVar18->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
        pUVar16)) {
      JavascriptError::ThrowReferenceError(pSVar18,-0x7ff5ec07,(PCWSTR)0x0);
    }
    puVar4 = *(undefined8 **)(this + 0x20);
    if (puVar4 == (undefined8 *)0x0) {
      pSVar18 = (ScriptContext *)0x0;
    }
    else {
      pSVar18 = (ScriptContext *)*puVar4;
    }
    if (pSVar18 != (ScriptContext *)instance && puVar4 != (undefined8 *)0x0) {
      AssertCount = AssertCount + 1;
      local_58 = pSVar18;
      local_50 = (ScriptContext *)instance;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x588,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar6) goto LAB_00e1c40f;
      *puVar12 = 0;
      pSVar18 = local_58;
      instance = (DynamicObject *)local_50;
    }
    if ((*(byte *)pSStack_40 & 2) == 0) {
      if ((((local_34 & PropertyOperation_PreInit) == PropertyOperation_None) &&
          (*(byte *)pSStack_40 = *(byte *)pSStack_40 | 2, pSVar18 == (ScriptContext *)instance)) &&
         (TPropertyKey_IsInternalPropertyId(propertyKey),
         (local_34 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
         PropertyOperation_None)) {
        local_50 = (ScriptContext *)instance;
        if (((byte)this[9] & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x594,"(!GetIsShared())","!GetIsShared()");
          if (!bVar6) goto LAB_00e1c40f;
          *puVar12 = 0;
        }
        if (value == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x595,"(value != nullptr)","value != nullptr");
          if (!bVar6) goto LAB_00e1c40f;
          *puVar12 = 0;
        }
        instance = (DynamicObject *)local_50;
        BVar11 = RecyclableObject::IsExternal((RecyclableObject *)local_50);
        if (BVar11 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar6) {
LAB_00e1c40f:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar12 = 0;
          instance = (DynamicObject *)local_50;
        }
        bVar6 = VarIs<Js::JavascriptFunction>(value);
        if (bVar6) {
          bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
          bVar6 = !bVar6;
        }
        else {
          bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
          if (bVar6) {
            bVar6 = false;
          }
          else {
            bVar6 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                              (instance,(PropertyId)local_60,value);
          }
        }
        *(byte *)pSStack_40 = *(byte *)pSStack_40 & 0xfb | bVar6 << 2;
      }
    }
    else {
      InvalidateFixedField<Js::JavascriptString*>
                (this,propertyKey,pSStack_40,
                 (ScriptContext *)
                 (((((ScriptContext *)instance)->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).globalObject.ptr[0xb].super_RootObjectBase.
                 super_DynamicObject.field_1);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)pSStack_40->propertyIndex,value);
    if (((uint)*pSStack_40 & 6) == 2) {
      if (info == (PropertyValueInfo *)0x0) goto LAB_00e1c397;
      PVar7 = pSStack_40->Attributes;
      uVar17 = pSStack_40->propertyIndex;
    }
    else {
      if (info == (PropertyValueInfo *)0x0) goto LAB_00e1c397;
      uVar17 = 0xffff;
      PVar7 = '\0';
    }
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = uVar17;
    info->m_attributes = PVar7;
    info->flags = InlineCacheNoFlags;
  }
LAB_00e1c397:
  propertyId_00 =
       TPropertyKey_GetUpdateSideEffectPropertyId<Js::JavascriptString*>
                 ((PropertyId)local_60,propertyKey);
  if (propertyId_00 != -1) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,propertyId_00,value,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }